

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ProductionSyntax::ProductionSyntax
          (ProductionSyntax *this,DataTypeSyntax *dataType,Token name,
          FunctionPortListSyntax *portList,Token colon,
          SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *rules,Token semi)

{
  bool bVar1;
  RsRuleSyntax *pRVar2;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  RsRuleSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *rhs;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *this_00;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)&child;
  rhs = (SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)&stack0x00000008;
  SyntaxNode::SyntaxNode(in_RDI,Production);
  *(undefined8 *)(in_RDI + 1) = in_RSI;
  in_RDI[1].parent = in_RDX;
  in_RDI[1].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 2) = in_R8;
  in_RDI[2].parent = (SyntaxNode *)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].previewNode = *(SyntaxNode **)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::SeparatedSyntaxList(this_00,rhs);
  in_RDI[5].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[5].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  if (*(long *)(in_RDI + 1) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 1) + 8) = in_RDI;
  }
  if (*(long *)(in_RDI + 2) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 2) + 8) = in_RDI;
  }
  in_RDI[3].previewNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)0xa3c611);
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<slang::syntax::RsRuleSyntax_*>_>
                      ((self_type *)this_00,(iterator_base<slang::syntax::RsRuleSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pRVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<slang::syntax::RsRuleSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<slang::syntax::RsRuleSyntax_*>,_false>
                          *)0xa3c650);
    (pRVar2->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<slang::syntax::RsRuleSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<slang::syntax::RsRuleSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<slang::syntax::RsRuleSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

ProductionSyntax(DataTypeSyntax* dataType, Token name, FunctionPortListSyntax* portList, Token colon, const SeparatedSyntaxList<RsRuleSyntax>& rules, Token semi) :
        SyntaxNode(SyntaxKind::Production), dataType(dataType), name(name), portList(portList), colon(colon), rules(rules), semi(semi) {
        if (this->dataType) this->dataType->parent = this;
        if (this->portList) this->portList->parent = this;
        this->rules.parent = this;
        for (auto child : this->rules)
            child->parent = this;
    }